

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xout.h
# Opt level: O2

ostream * operator<<(ostream *__cout,_xout_color c)

{
  int iVar1;
  
  iVar1 = -0x37;
  if ((byte)(c.m_c - 0x30) < 10) {
    iVar1 = -0x30;
  }
  else if (5 < (byte)(c.m_c + 0xbf)) {
    return __cout;
  }
  printf("%s",&DAT_0012f0a8 + *(int *)(&DAT_0012f0a8 + (ulong)(iVar1 + (uint)c.m_c) * 4));
  return __cout;
}

Assistant:

inline std::ostream& operator<<(std::ostream& __cout, ispring::_xout_color c) {
	const char* palette[] = {
		"\x1b[30m",
		"\x1b[34m",
		"\x1b[32m",
		"\x1b[36m",
		"\x1b[31m",
		"\x1b[35m",
		"\x1b[33m",
		"\x1b[37m",
		"\x1b[90m",
		"\x1b[94m",
		"\x1b[92m",
		"\x1b[96m",
		"\x1b[91m",
		"\x1b[95m",
		"\x1b[93m",
		"\x1b[97m",
	};
	if ('0' <= c.m_c && c.m_c <= '9') {
		printf("%s", palette[c.m_c - 48]);
	} else if ('A' <= c.m_c && c.m_c <= 'F') {
		printf("%s", palette[c.m_c - 65 + 10]);
	}
	return __cout;
}